

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.cc
# Opt level: O3

optional<unsigned_long> __thiscall bloaty::dwarf::AttrValue::ToUint(AttrValue *this,CU *cu)

{
  _Storage<unsigned_long,_true> in_RAX;
  _Storage<unsigned_long,_true> *p_Var1;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  string_view sVar3;
  optional<unsigned_long> oVar4;
  
  if (this->form_ == 0x21) {
switchD_001b7002_default:
    uVar2 = 0;
  }
  else {
    if ((this->type_ & ~kUnresolvedUint) == kUint) {
      in_RAX._M_value = GetUint(this,cu);
      uVar2 = extraout_RDX;
    }
    else {
      sVar3 = GetString(this,cu);
      p_Var1 = (_Storage<unsigned_long,_true> *)sVar3._M_str;
      uVar2 = 0;
      in_RAX._M_value = sVar3._M_len - 1;
      switch(in_RAX._M_value) {
      case 0:
      case 1:
        in_RAX._M_value._1_7_ = 0;
        in_RAX._M_value._0_1_ = *(byte *)p_Var1;
        break;
      case 2:
      case 4:
      case 5:
      case 6:
        goto switchD_001b7002_caseD_2;
      case 3:
        in_RAX._M_value._4_4_ = 0;
        in_RAX._M_value._0_4_ = *(uint *)p_Var1;
        break;
      case 7:
        in_RAX = (_Storage<unsigned_long,_true>)p_Var1->_M_value;
        break;
      default:
        goto switchD_001b7002_default;
      }
    }
    uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
  }
switchD_001b7002_caseD_2:
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar2;
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = in_RAX._M_value;
  return (optional<unsigned_long>)
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

absl::optional<uint64_t> AttrValue::ToUint(const CU& cu) const {
  if (form_ == DW_FORM_implicit_const) {
    // DW_FORM_implicit_const value is stored in AbbrevTable, but
    // we don't keep it in AttrValue (discarded in AbbrevTable::ReadAbbrevs()).
    // return absl::nullopt to make sure the value is not available.
    return absl::nullopt;
  }
  if (IsUint()) return GetUint(cu);
  string_view str = GetString(cu);
  switch (str.size()) {
    case 1:
      return ReadFixed<uint8_t>(&str);
    case 2:
      return ReadFixed<uint8_t>(&str);
    case 4:
      return ReadFixed<uint32_t>(&str);
    case 8:
      return ReadFixed<uint64_t>(&str);
  }
  return absl::nullopt;
}